

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<float>::RepeatedField
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  int iVar1;
  void **ppvVar2;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  ppvVar2 = (void **)((long)other->arena_or_elements_ + -8);
  if (other->total_size_ == 0) {
    ppvVar2 = &other->arena_or_elements_;
  }
  if (*ppvVar2 == (void *)0x0) {
    this->arena_or_elements_ = other->arena_or_elements_;
    other->arena_or_elements_ = (void *)0x0;
    this->current_size_ = other->current_size_;
    other->current_size_ = 0;
    iVar1 = this->total_size_;
    this->total_size_ = other->total_size_;
    other->total_size_ = iVar1;
  }
  else if ((other != this) && (other->current_size_ != 0)) {
    Reserve(this,other->current_size_);
    this->current_size_ = this->current_size_ + other->current_size_;
    memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 2);
    return;
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArenaNoVirtual()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}